

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

ucs4_t * utf8_to_ucs4(char *utf8,size_t length)

{
  byte bVar1;
  ulong uVar2;
  int *__ptr;
  ucs4_t *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar12 = 0;
  uVar2 = -(ulong)(length == 0) | length + (length == 0);
  do {
    uVar13 = uVar12;
    if (utf8[uVar12] == '\0') break;
    uVar12 = uVar12 + 1;
    uVar13 = uVar2;
  } while (uVar2 != uVar12);
  __ptr = (int *)malloc(0x1000);
  piVar8 = __ptr;
  if (uVar13 != 0) {
    lVar4 = 0x400;
    uVar2 = 0;
    do {
      bVar1 = utf8[uVar2];
      uVar5 = (uint)(char)bVar1;
      if ((char)bVar1 < '\0') {
        if ((uVar5 & 0x20) != 0) {
          if ((bVar1 & 0x10) == 0) {
            uVar12 = uVar2 + 2;
            if (uVar13 <= uVar12) goto LAB_00103fde;
            uVar6 = ((int)utf8[uVar2 + 1] & 3U) << 6 | (byte)utf8[uVar2 + 2] & 0x3f;
            uVar11 = (uVar5 & 0xf) << 4 | (uint)(int)utf8[uVar2 + 1] >> 2 & 0xf;
            goto LAB_00103e1e;
          }
          if ((uVar5 & 8) == 0) {
            uVar12 = uVar2 + 3;
            iVar9 = 0;
            if (uVar13 <= uVar12) goto LAB_00103fe1;
            uVar6 = ((int)utf8[uVar2 + 2] & 3U) << 6 | (byte)utf8[uVar2 + 3] & 0x3f;
            uVar11 = ((int)utf8[uVar2 + 1] & 0xfU) << 4 | (uint)(int)utf8[uVar2 + 2] >> 2 & 0xf;
            uVar10 = ((uint)(int)utf8[uVar2 + 1] >> 4 & 3) + (uVar5 & 7) * 4;
          }
          else {
            if (((bVar1 & 4) != 0) || (uVar12 = uVar2 + 4, uVar13 <= uVar12)) goto LAB_00103fde;
            uVar6 = ((int)utf8[uVar2 + 3] & 3U) << 6 | (byte)utf8[uVar2 + 4] & 0x3f;
            uVar11 = ((int)utf8[uVar2 + 2] & 0xfU) << 4 | (uint)(int)utf8[uVar2 + 3] >> 2 & 0xf;
            uVar10 = (uint)(byte)(utf8[uVar2 + 1] << 2) | (uint)(int)utf8[uVar2 + 2] >> 4 & 3;
            iVar9 = (uVar5 & 3) << 0x18;
          }
          goto LAB_00103e21;
        }
        uVar12 = uVar2 + 1;
        if (uVar12 < uVar13) {
          uVar6 = (uVar5 & 3) << 6 | (byte)utf8[uVar12] & 0x3f;
          uVar11 = uVar5 >> 2 & 7;
          goto LAB_00103e1e;
        }
LAB_00103fde:
        iVar9 = 0;
      }
      else {
        uVar6 = uVar5 & 0x7f;
        uVar11 = 0;
        uVar12 = uVar2;
LAB_00103e1e:
        uVar10 = 0;
        iVar9 = 0;
LAB_00103e21:
        if (lVar4 == 0) {
          lVar7 = (long)piVar8 - (long)__ptr;
          lVar4 = lVar7 >> 2;
          __ptr = (int *)realloc(__ptr,lVar7 * 2);
          piVar8 = (int *)(lVar7 + (long)__ptr);
        }
        *piVar8 = (uVar11 << 8 | uVar6 | uVar10 << 0x10) + iVar9;
        piVar8 = piVar8 + 1;
        lVar4 = lVar4 + -1;
        iVar9 = 1;
        uVar2 = uVar12;
      }
LAB_00103fe1:
      if ((char)iVar9 == '\0') {
        free(__ptr);
        return (ucs4_t *)0xffffffffffffffff;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar13);
  }
  puVar3 = (ucs4_t *)realloc(__ptr,((long)piVar8 - (long)__ptr) + 4);
  *(undefined4 *)((long)puVar3 + ((long)piVar8 - (long)__ptr)) = 0;
  return puVar3;
}

Assistant:

ucs4_t * utf8_to_ucs4(const char * utf8, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && utf8[i] != '\0'; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	ucs4_t * ucs4 = (ucs4_t *) malloc(sizeof(ucs4_t) * freesize);
	ucs4_t * pucs4 = ucs4;

	for (i = 0; i < length; i ++)
	{
		ucs4_t byte[4] = {0};
		if (GET_BIT(utf8[i], 7) == 0)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			byte[0] = utf8[i] & BITMASK(7);
		}
		else if (GET_BIT(utf8[i], 5) == 0)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			if (i + 1 >= length)
				goto err;

			byte[0] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(2)) << 6);
			byte[1] = (utf8[i] >> 2) & BITMASK(3);

			i += 1;
		}
		else if (GET_BIT(utf8[i], 4) == 0)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			if (i + 2 >= length)
				goto err;

			byte[0] = (utf8[i + 2] & BITMASK(6)) +
					((utf8[i + 1] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 1] >> 2) & BITMASK(4))
					+ ((utf8[i] & BITMASK(4)) << 4);

			i += 2;
		}
		else if (GET_BIT(utf8[i], 3) == 0)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 3 >= length)
				goto err;

			byte[0] = (utf8[i + 3] & BITMASK(6)) +
					((utf8[i + 2] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 2] >> 2) & BITMASK(4)) +
					((utf8[i + 1] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 1] >> 4) & BITMASK(2)) +
					((utf8[i] & BITMASK(3)) << 2);

			i += 3;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 4 >= length)
				goto err;

			byte[0] = (utf8[i + 4] & BITMASK(6)) +
					((utf8[i + 3] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 3] >> 2) & BITMASK(4)) +
					((utf8[i + 2] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 2] >> 4) & BITMASK(2)) +
					((utf8[i + 1] & BITMASK(6)) << 2);
			byte[3] = utf8[i] & BITMASK(2);
			i += 4;
		}
		else if (GET_BIT(utf8[i], 2) == 0)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			if (i + 5 >= length)
				goto err;

			byte[0] = (utf8[i + 5] & BITMASK(6)) +
					((utf8[i + 4] & BITMASK(2)) << 6);
			byte[1] = ((utf8[i + 4] >> 2) & BITMASK(4)) +
					((utf8[i + 3] & BITMASK(4)) << 4);
			byte[2] = ((utf8[i + 3] >> 4) & BITMASK(2)) +
					((utf8[i + 2] & BITMASK(6)) << 2);
			byte[3] = (utf8[i + 1] & BITMASK(6)) +
					((utf8[i] & BITMASK(1)) << 6);
			i += 5;
		}
		else
			goto err;

		if (freesize == 0)
		{
			freesize = pucs4 - ucs4;
			ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * (freesize + freesize));
			pucs4 = ucs4 + freesize;
		}

		*pucs4 = (byte[3] << 24) + (byte[2] << 16) + (byte[1] << 8) + byte[0];

		pucs4 ++;
		freesize --;
	}

	length = (pucs4 - ucs4 + 1);
	ucs4 = (ucs4_t *) realloc(ucs4, sizeof(ucs4_t) * length);
	ucs4[length - 1] = 0;
	return ucs4;

err:
	free(ucs4);
	return (ucs4_t *) -1;
}